

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

char * google::protobuf::internal::WireFormat::_InternalParseAndMergeField
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  double value_00;
  FieldDescriptor FVar1;
  byte bVar2;
  MessageFactory *pMVar3;
  anon_class_32_4_91646d40 add;
  bool bVar4;
  bool bVar5;
  float fVar6;
  LogMessage *other;
  UnknownFieldSet *pUVar7;
  char *pcVar8;
  Message *msg_00;
  _func_void_FieldDescriptor_ptr *p_Var9;
  MessageLite *msg_01;
  RepeatedField<int> *pRVar10;
  RepeatedField<unsigned_int> *pRVar11;
  RepeatedField<bool> *object;
  RepeatedField<double> *object_00;
  RepeatedField<float> *object_01;
  RepeatedField<long> *pRVar12;
  RepeatedField<unsigned_long> *pRVar13;
  _Alloc_hider _Var14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  double *pdVar17;
  pair<const_char_*,_int> pVar18;
  uint32_t value;
  double *local_d8;
  undefined1 local_d0 [56];
  FieldDescriptor *local_98;
  string local_90;
  string local_70;
  RepeatedField<int> *local_50;
  FieldDescriptor *pFStack_48;
  Reflection *local_40;
  Message *pMStack_38;
  
  local_d8 = (double *)ptr;
  if (field == (FieldDescriptor *)0x0) {
    pUVar7 = Reflection::MutableUnknownFields(reflection,msg);
    pcVar8 = UnknownFieldParse(tag,pUVar7,(char *)local_d8,ctx);
    return pcVar8;
  }
  uVar16 = (uint)tag & 7;
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_98 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,&local_98);
  }
  if (uVar16 != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)(byte)field[2] * 4)) {
    if ((~(byte)field[1] & 0x60) != 0) {
LAB_003c5bec:
      pUVar7 = Reflection::MutableUnknownFields(reflection,msg);
      pcVar8 = UnknownFieldParse(tag,pUVar7,(char *)local_d8,ctx);
      return pcVar8;
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_98 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,&local_98
                );
    }
    if ((uVar16 != 2) || (0xfffffffb < (byte)field[2] - 0xd)) goto LAB_003c5bec;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_98 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,&local_98
                );
    }
    switch(field[2]) {
    case (FieldDescriptor)0x1:
      object_00 = Reflection::MutableRepeatedFieldInternal<double>(reflection,msg,field);
      pcVar8 = PackedDoubleParser(object_00,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x2:
      object_01 = Reflection::MutableRepeatedFieldInternal<float>(reflection,msg,field);
      pcVar8 = PackedFloatParser(object_01,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x3:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedInt64Parser(pRVar12,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x4:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar8 = PackedUInt64Parser(pRVar13,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x5:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedInt32Parser(pRVar10,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x6:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_long>(reflection,msg,field);
      pcVar8 = PackedFixed64Parser(pRVar13,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x7:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar8 = PackedFixed32Parser(pRVar11,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x8:
      object = Reflection::MutableRepeatedFieldInternal<bool>(reflection,msg,field);
      pcVar8 = PackedBoolParser(object,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x9:
    case (FieldDescriptor)0xa:
    case (FieldDescriptor)0xb:
    case (FieldDescriptor)0xc:
      LogMessage::LogMessage
                ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
                 ,0x372);
      other = LogMessage::operator<<((LogMessage *)local_d0,"Can\'t reach");
      LogFinisher::operator=((LogFinisher *)&local_98,other);
      LogMessage::~LogMessage((LogMessage *)local_d0);
      return (char *)0x0;
    case (FieldDescriptor)0xd:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<unsigned_int>(reflection,msg,field);
      pcVar8 = PackedUInt32Parser(pRVar11,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0xe:
      local_50 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      if (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03') {
        pcVar8 = PackedEnumParser(local_50,(char *)local_d8,ctx);
        return pcVar8;
      }
      add.field = field;
      add.rep_enum = local_50;
      add.reflection = reflection;
      add.msg = msg;
      pFStack_48 = field;
      local_40 = reflection;
      pMStack_38 = msg;
      pcVar8 = EpsCopyInputStream::
               ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                         (&ctx->super_EpsCopyInputStream,(char *)local_d8,add);
      return pcVar8;
    case (FieldDescriptor)0xf:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedSFixed32Parser(pRVar10,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x10:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedSFixed64Parser(pRVar12,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x11:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>(reflection,msg,field);
      pcVar8 = PackedSInt32Parser(pRVar10,(char *)local_d8,ctx);
      return pcVar8;
    case (FieldDescriptor)0x12:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<long>(reflection,msg,field);
      pcVar8 = PackedSInt64Parser(pRVar12,(char *)local_d8,ctx);
      return pcVar8;
    }
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_98 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,&local_98);
  }
  bVar5 = false;
  switch(field[2]) {
  case (FieldDescriptor)0x1:
    value_00 = *local_d8;
    local_d8 = local_d8 + 1;
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddDouble(reflection,msg,field,value_00);
      return (char *)local_d8;
    }
    Reflection::SetDouble(reflection,msg,field,value_00);
    return (char *)local_d8;
  case (FieldDescriptor)0x2:
    fVar6 = *(float *)local_d8;
    local_d8 = (double *)((long)local_d8 + 4);
    if ((~(byte)field[1] & 0x60) == 0) {
      Reflection::AddFloat(reflection,msg,field,fVar6);
      return (char *)local_d8;
    }
    Reflection::SetFloat(reflection,msg,field,fVar6);
    return (char *)local_d8;
  case (FieldDescriptor)0x3:
    local_d8 = (double *)VarintParse<unsigned_long>((char *)local_d8,(unsigned_long *)local_d0);
    if (local_d8 != (double *)0x0) {
      FVar1 = field[1];
      p_Var9 = (_func_void_FieldDescriptor_ptr *)local_d0._0_8_;
      goto joined_r0x003c5e1b;
    }
    break;
  case (FieldDescriptor)0x4:
    local_d8 = (double *)VarintParse<unsigned_long>((char *)local_d8,(unsigned_long *)local_d0);
    if (local_d8 != (double *)0x0) {
      FVar1 = field[1];
      p_Var9 = (_func_void_FieldDescriptor_ptr *)local_d0._0_8_;
      goto LAB_003c5e44;
    }
    break;
  case (FieldDescriptor)0x5:
    local_d8 = (double *)VarintParse<unsigned_int>((char *)local_d8,(uint *)local_d0);
    if (local_d8 != (double *)0x0) {
      FVar1 = field[1];
      fVar6 = (float)local_d0._0_4_;
      goto joined_r0x003c5c3b;
    }
    break;
  case (FieldDescriptor)0x6:
    p_Var9 = (_func_void_FieldDescriptor_ptr *)*local_d8;
    local_d8 = local_d8 + 1;
    FVar1 = field[1];
LAB_003c5e44:
    if ((~(byte)FVar1 & 0x60) == 0) {
      Reflection::AddUInt64(reflection,msg,field,(uint64_t)p_Var9);
      return (char *)local_d8;
    }
    Reflection::SetUInt64(reflection,msg,field,(uint64_t)p_Var9);
    return (char *)local_d8;
  case (FieldDescriptor)0x7:
    fVar6 = *(float *)local_d8;
    local_d8 = (double *)((long)local_d8 + 4);
    FVar1 = field[1];
LAB_003c5eb5:
    if ((~(byte)FVar1 & 0x60) == 0) {
      Reflection::AddUInt32(reflection,msg,field,(uint32_t)fVar6);
      return (char *)local_d8;
    }
    Reflection::SetUInt32(reflection,msg,field,(uint32_t)fVar6);
    return (char *)local_d8;
  case (FieldDescriptor)0x8:
    local_d8 = (double *)VarintParse<unsigned_long>((char *)local_d8,(unsigned_long *)local_d0);
    if (local_d8 != (double *)0x0) {
      if ((~(byte)field[1] & 0x60) == 0) {
        Reflection::AddBool(reflection,msg,field,
                            (_func_void_FieldDescriptor_ptr *)local_d0._0_8_ !=
                            (_func_void_FieldDescriptor_ptr *)0x0);
        return (char *)local_d8;
      }
      Reflection::SetBool(reflection,msg,field,
                          (_func_void_FieldDescriptor_ptr *)local_d0._0_8_ !=
                          (_func_void_FieldDescriptor_ptr *)0x0);
      return (char *)local_d8;
    }
    break;
  case (FieldDescriptor)0x9:
    bVar5 = *(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03';
    bVar4 = true;
    goto LAB_003c5f00;
  case (FieldDescriptor)0xa:
    pMVar3 = (ctx->data_).factory;
    if ((~(byte)field[1] & 0x60) == 0) {
      msg_00 = Reflection::AddMessage(reflection,msg,field,pMVar3);
    }
    else {
      msg_00 = Reflection::MutableMessage(reflection,msg,field,pMVar3);
    }
    pcVar8 = ParseContext::ParseGroup<google::protobuf::Message>
                       (ctx,msg_00,(char *)local_d8,(uint)tag);
    return pcVar8;
  case (FieldDescriptor)0xb:
    pMVar3 = (ctx->data_).factory;
    if ((~(byte)field[1] & 0x60) == 0) {
      msg_01 = &Reflection::AddMessage(reflection,msg,field,pMVar3)->super_MessageLite;
    }
    else {
      msg_01 = &Reflection::MutableMessage(reflection,msg,field,pMVar3)->super_MessageLite;
    }
    pcVar8 = ParseContext::ParseMessage(ctx,msg_01,(char *)local_d8);
    return pcVar8;
  case (FieldDescriptor)0xc:
    bVar4 = false;
LAB_003c5f00:
    bVar2 = *(byte *)local_d8;
    uVar16 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      pVar18 = ReadSizeFallback((char *)local_d8,(uint)bVar2);
      uVar16 = pVar18.second;
      local_d8 = (double *)pVar18.first;
    }
    else {
      local_d8 = (double *)((long)local_d8 + 1);
    }
    if (local_d8 == (double *)0x0) {
      return (char *)0x0;
    }
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    local_d8 = (double *)
               EpsCopyInputStream::ReadString
                         (&ctx->super_EpsCopyInputStream,(char *)local_d8,uVar16,(string *)local_d0)
    ;
    if (local_d8 == (double *)0x0) {
LAB_003c5f99:
      pdVar17 = (double *)0x0;
    }
    else {
      if (bVar4) {
        if (bVar5) {
          bVar5 = WireFormatLite::VerifyUtf8String
                            ((char *)local_d0._0_8_,local_d0._8_4_,PARSE,
                             *(char **)(*(long *)(field + 8) + 0x20));
          if (!bVar5) goto LAB_003c5f99;
        }
        else {
          WireFormatLite::VerifyUtf8String
                    ((char *)local_d0._0_8_,local_d0._8_4_,PARSE,
                     *(char **)(*(long *)(field + 8) + 0x20));
        }
      }
      if ((~(byte)field[1] & 0x60) == 0) {
        paVar15 = &local_70.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_d0 + 0x10)) {
          local_70.field_2._8_8_ = local_d0._24_8_;
          local_70._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_70._M_dataplus._M_p = (pointer)local_d0._0_8_;
        }
        local_70.field_2._M_allocated_capacity._1_7_ = local_d0._17_7_;
        local_70.field_2._M_local_buf[0] = local_d0[0x10];
        local_70._M_string_length = local_d0._8_8_;
        local_d0._8_8_ = (char *)0x0;
        local_d0[0x10] = '\0';
        local_d0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d0 + 0x10);
        Reflection::AddString(reflection,msg,field,&local_70);
        _Var14._M_p = local_70._M_dataplus._M_p;
      }
      else {
        paVar15 = &local_90.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_d0 + 0x10)) {
          local_90.field_2._8_8_ = local_d0._24_8_;
          local_90._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_90._M_dataplus._M_p = (pointer)local_d0._0_8_;
        }
        local_90.field_2._M_allocated_capacity._1_7_ = local_d0._17_7_;
        local_90.field_2._M_local_buf[0] = local_d0[0x10];
        local_90._M_string_length = local_d0._8_8_;
        local_d0._8_8_ = (char *)0x0;
        local_d0[0x10] = '\0';
        local_d0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_d0 + 0x10);
        Reflection::SetString(reflection,msg,field,&local_90);
        _Var14._M_p = local_90._M_dataplus._M_p;
      }
      pdVar17 = local_d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var14._M_p != paVar15) {
        operator_delete(_Var14._M_p);
        pdVar17 = local_d8;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) {
      return (char *)pdVar17;
    }
    operator_delete((void *)local_d0._0_8_);
    return (char *)pdVar17;
  case (FieldDescriptor)0xd:
    local_d8 = (double *)VarintParse<unsigned_int>((char *)local_d8,(uint *)local_d0);
    if (local_d8 != (double *)0x0) {
      FVar1 = field[1];
      fVar6 = (float)local_d0._0_4_;
      goto LAB_003c5eb5;
    }
    break;
  case (FieldDescriptor)0xe:
    local_d8 = (double *)VarintParse<unsigned_int>((char *)local_d8,(uint *)local_d0);
    if (local_d8 != (double *)0x0) {
      if ((~(byte)field[1] & 0x60) == 0) {
        Reflection::AddEnumValue(reflection,msg,field,local_d0._0_4_);
        return (char *)local_d8;
      }
      Reflection::SetEnumValue(reflection,msg,field,local_d0._0_4_);
      return (char *)local_d8;
    }
    break;
  case (FieldDescriptor)0xf:
    fVar6 = *(float *)local_d8;
    local_d8 = (double *)((long)local_d8 + 4);
    FVar1 = field[1];
joined_r0x003c5c3b:
    if ((~(byte)FVar1 & 0x60) == 0) {
      Reflection::AddInt32(reflection,msg,field,(int32_t)fVar6);
      return (char *)local_d8;
    }
    Reflection::SetInt32(reflection,msg,field,(int32_t)fVar6);
    return (char *)local_d8;
  case (FieldDescriptor)0x10:
    p_Var9 = (_func_void_FieldDescriptor_ptr *)*local_d8;
    local_d8 = local_d8 + 1;
    FVar1 = field[1];
joined_r0x003c5e1b:
    if ((~(byte)FVar1 & 0x60) == 0) {
      Reflection::AddInt64(reflection,msg,field,(int64_t)p_Var9);
      return (char *)local_d8;
    }
    Reflection::SetInt64(reflection,msg,field,(int64_t)p_Var9);
    return (char *)local_d8;
  case (FieldDescriptor)0x11:
    fVar6 = (float)ReadVarintZigZag32((char **)&local_d8);
    if (local_d8 != (double *)0x0) {
      FVar1 = field[1];
      goto joined_r0x003c5c3b;
    }
    break;
  case (FieldDescriptor)0x12:
    p_Var9 = (_func_void_FieldDescriptor_ptr *)ReadVarintZigZag64((char **)&local_d8);
    if (local_d8 != (double *)0x0) {
      FVar1 = field[1];
      goto joined_r0x003c5e1b;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* WireFormat::_InternalParseAndMergeField(
    Message* msg, const char* ptr, internal::ParseContext* ctx, uint64_t tag,
    const Reflection* reflection, const FieldDescriptor* field) {
  if (field == nullptr) {
    // unknown field set parser takes 64bit tags, because message set type ids
    // span the full 32 bit range making the tag span [0, 2^35) range.
    return internal::UnknownFieldParse(
        tag, reflection->MutableUnknownFields(msg), ptr, ctx);
  }
  if (WireFormatLite::GetTagWireType(tag) !=
      WireTypeForFieldType(field->type())) {
    if (field->is_packable() && WireFormatLite::GetTagWireType(tag) ==
                                    WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ptr = internal::Packed##CPPTYPE_METHOD##Parser(                         \
        reflection->MutableRepeatedFieldInternal<CPPTYPE>(msg, field), ptr, \
        ctx);                                                               \
    return ptr;                                                             \
  }

        HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
        HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
        HANDLE_PACKED_TYPE(SINT32, int32_t, SInt32)
        HANDLE_PACKED_TYPE(SINT64, int64_t, SInt64)
        HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
        HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

        HANDLE_PACKED_TYPE(FIXED32, uint32_t, Fixed32)
        HANDLE_PACKED_TYPE(FIXED64, uint64_t, Fixed64)
        HANDLE_PACKED_TYPE(SFIXED32, int32_t, SFixed32)
        HANDLE_PACKED_TYPE(SFIXED64, int64_t, SFixed64)

        HANDLE_PACKED_TYPE(FLOAT, float, Float)
        HANDLE_PACKED_TYPE(DOUBLE, double, Double)

        HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

        case FieldDescriptor::TYPE_ENUM: {
          auto rep_enum =
              reflection->MutableRepeatedFieldInternal<int>(msg, field);
          bool open_enum = false;
          if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 ||
              open_enum) {
            ptr = internal::PackedEnumParser(rep_enum, ptr, ctx);
          } else {
            return ctx->ReadPackedVarint(
                ptr, [rep_enum, field, reflection, msg](uint64_t val) {
                  if (field->enum_type()->FindValueByNumber(val) != nullptr) {
                    rep_enum->Add(val);
                  } else {
                    WriteVarint(field->number(), val,
                                reflection->MutableUnknownFields(msg));
                  }
                });
          }
          return ptr;
        }

        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE:
        case FieldDescriptor::TYPE_BYTES:
          GOOGLE_LOG(FATAL) << "Can't reach";
          return nullptr;
      }
    } else {
      // mismatched wiretype;
      return internal::UnknownFieldParse(
          tag, reflection->MutableUnknownFields(msg), ptr, ctx);
    }
  }

  // Non-packed value
  bool utf8_check = false;
  bool strict_utf8_check = false;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    ptr = VarintParse(ptr, &value);                       \
    if (ptr == nullptr) return nullptr;                   \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

    HANDLE_TYPE(BOOL, uint64_t, Bool)
    HANDLE_TYPE(INT32, uint32_t, Int32)
    HANDLE_TYPE(INT64, uint64_t, Int64)
    HANDLE_TYPE(UINT32, uint32_t, UInt32)
    HANDLE_TYPE(UINT64, uint64_t, UInt64)

    case FieldDescriptor::TYPE_SINT32: {
      int32_t value = ReadVarintZigZag32(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt32(msg, field, value);
      } else {
        reflection->SetInt32(msg, field, value);
      }
      return ptr;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64_t value = ReadVarintZigZag64(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt64(msg, field, value);
      } else {
        reflection->SetInt64(msg, field, value);
      }
      return ptr;
    }
#undef HANDLE_TYPE
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    value = UnalignedLoad<CPPTYPE>(ptr);                  \
    ptr += sizeof(CPPTYPE);                               \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

#undef HANDLE_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      uint32_t value;
      ptr = VarintParse(ptr, &value);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      return ptr;
    }

    // Handle strings separately so that we can optimize the ctype=CORD case.
    case FieldDescriptor::TYPE_STRING:
      utf8_check = true;
      strict_utf8_check = StrictUtf8Check(field);
      PROTOBUF_FALLTHROUGH_INTENDED;
    case FieldDescriptor::TYPE_BYTES: {
      int size = ReadSize(&ptr);
      if (ptr == nullptr) return nullptr;
      std::string value;
      ptr = ctx->ReadString(ptr, size, &value);
      if (ptr == nullptr) return nullptr;
      if (utf8_check) {
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return nullptr;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
      }
      if (field->is_repeated()) {
        reflection->AddString(msg, field, std::move(value));
      } else {
        reflection->SetString(msg, field, std::move(value));
      }
      return ptr;
    }

    case FieldDescriptor::TYPE_GROUP: {
      Message* sub_message;
      if (field->is_repeated()) {
        sub_message = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        sub_message =
            reflection->MutableMessage(msg, field, ctx->data().factory);
      }

      return ctx->ParseGroup(sub_message, ptr, tag);
    }

    case FieldDescriptor::TYPE_MESSAGE: {
      Message* sub_message;
      if (field->is_repeated()) {
        sub_message = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        sub_message =
            reflection->MutableMessage(msg, field, ctx->data().factory);
      }
      return ctx->ParseMessage(sub_message, ptr);
    }
  }

  // GCC 8 complains about control reaching end of non-void function here.
  // Let's keep it happy by returning a nullptr.
  return nullptr;
}